

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_293e0d::ArgParser::argPagesPositional(ArgParser *this,string *arg)

{
  element_type *peVar1;
  char *range;
  runtime_error *e1;
  vector<int,_std::allocator<int>_> local_30;
  string *local_18;
  string *arg_local;
  ArgParser *this_local;
  
  local_18 = arg;
  arg_local = (string *)this;
  if ((this->called_pages_file & 1U) == 0) {
    peVar1 = std::
             __shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->c_pages);
    QPDFJob::PagesConfig::file(peVar1,local_18);
    this->called_pages_file = true;
  }
  else if ((this->called_pages_range & 1U) == 0) {
    range = (char *)std::__cxx11::string::c_str();
    QUtil::parse_numrange(&local_30,range,0);
    std::vector<int,_std::allocator<int>_>::~vector(&local_30);
    peVar1 = std::
             __shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->c_pages);
    QPDFJob::PagesConfig::range(peVar1,local_18);
    this->called_pages_range = true;
  }
  else {
    peVar1 = std::
             __shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->c_pages);
    QPDFJob::PagesConfig::file(peVar1,local_18);
    this->called_pages_range = false;
  }
  return;
}

Assistant:

void
ArgParser::argPagesPositional(std::string const& arg)
{
    if (!called_pages_file) {
        c_pages->file(arg);
        called_pages_file = true;
        return;
    }
    if (called_pages_range) {
        c_pages->file(arg);
        called_pages_range = false;
        return;
    }
    // This could be a range or a file. Try parsing.
    try {
        QUtil::parse_numrange(arg.c_str(), 0);
        c_pages->range(arg);
        called_pages_range = true;
    } catch (std::runtime_error& e1) {
        // The range is invalid.  Let's see if it's a file.
        if (arg == ".") {
            // "." means the input file.
            QTC::TC("qpdf", "QPDFJob pages range omitted with .");
        } else if (QUtil::file_can_be_opened(arg.c_str())) {
            QTC::TC("qpdf", "QPDFJob pages range omitted in middle");
            // Yup, it's a file.
        } else {
            // Give the range error
            usage(e1.what());
        }
        c_pages->file(arg);
        called_pages_range = false;
    }
}